

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O0

int AF_A_SoAExplode(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  PClassActor *type_00;
  int iVar1;
  uint uVar2;
  AActor *pAVar3;
  bool bVar4;
  bool local_c2;
  bool local_bf;
  FSoundID local_bc;
  DVector3 local_b8;
  TFlags<ActorFlag3,_unsigned_int> local_9c;
  PClassActor *local_98;
  PClassActor *type;
  FName local_74;
  double local_70;
  double zo;
  double yo;
  double xo;
  AActor *pAStack_50;
  int i;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                  ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                  ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  stateowner = (AActor *)(param->field_0).field_1.a;
  local_bf = true;
  if (stateowner != (AActor *)0x0) {
    local_bf = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
  }
  if (local_bf == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                  ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  self._0_4_ = (int)self + 1;
  if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
    bVar4 = false;
    if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
       (bVar4 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
      bVar4 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                    ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
    local_c2 = true;
    if ((DObject *)stateinfo != (DObject *)0x0) {
      local_c2 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
    }
    if (local_c2 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                    ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  else {
    stateinfo = (FStateParamInfo *)stateowner;
  }
  self._0_4_ = (int)self + 1;
  if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
    bVar4 = false;
    if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
       (bVar4 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
      bVar4 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                    ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    mo = (AActor *)pVStack_18[(int)self].field_0.field_1.a;
  }
  else {
    mo = (AActor *)0x0;
  }
  for (xo._4_4_ = 0; xo._4_4_ < 10; xo._4_4_ = xo._4_4_ + 1) {
    iVar1 = FRandom::operator()(&pr_soaexplode);
    yo = (double)(iVar1 + -0x80) / 16.0;
    iVar1 = FRandom::operator()(&pr_soaexplode);
    zo = (double)(iVar1 + -0x80) / 16.0;
    iVar1 = FRandom::operator()(&pr_soaexplode);
    local_70 = ((double)iVar1 * stateowner->Height) / 256.0;
    FName::FName(&local_74,"ZArmorChunk");
    AActor::Vec3Offset((DVector3 *)&type,stateowner,yo,zo,local_70,false);
    pAStack_50 = Spawn(&local_74,(DVector3 *)&type,ALLOW_REPLACE);
    if (pAStack_50 != (AActor *)0x0) {
      AActor::SetState(pAStack_50,pAStack_50->SpawnState + xo._4_4_,false);
      iVar1 = FRandom::Random2(&pr_soaexplode);
      (pAStack_50->Vel).X = (double)iVar1 / 64.0;
      iVar1 = FRandom::Random2(&pr_soaexplode);
      (pAStack_50->Vel).Y = (double)iVar1 / 64.0;
      uVar2 = FRandom::operator()(&pr_soaexplode);
      (pAStack_50->Vel).Z = (double)((uVar2 & 7) + 5);
    }
  }
  local_98 = P_GetSpawnableType(stateowner->args[0]);
  if (local_98 == (PClassActor *)0x0) goto LAB_0079a6b3;
  if ((level.flags2 & 0x8000) == 0) {
    uVar2 = FIntCVar::operator_cast_to_int(&dmflags);
    bVar4 = true;
    if ((uVar2 & 0x1000) != 0) goto LAB_0079a62e;
  }
  else {
LAB_0079a62e:
    pAVar3 = GetDefaultByType(&local_98->super_PClass);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_9c,
               (int)pAVar3 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_9c);
    bVar4 = uVar2 == 0;
  }
  type_00 = local_98;
  if (bVar4) {
    AActor::Pos(&local_b8,stateowner);
    Spawn(type_00,&local_b8,ALLOW_REPLACE);
  }
LAB_0079a6b3:
  pAVar3 = stateowner;
  FSoundID::FSoundID(&local_bc,&(stateowner->DeathSound).super_FSoundID);
  S_Sound(pAVar3,4,&local_bc,1.0,1.0);
  (*(stateowner->super_DThinker).super_DObject._vptr_DObject[4])();
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SoAExplode)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int i;

	for (i = 0; i < 10; i++)
	{
		double xo = (pr_soaexplode() - 128) / 16.;
		double yo = (pr_soaexplode() - 128) / 16.;
		double zo = pr_soaexplode()*self->Height / 256.;
		mo = Spawn ("ZArmorChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + i);
			mo->Vel.X = pr_soaexplode.Random2() / 64.;
			mo->Vel.Y = pr_soaexplode.Random2() / 64.;
			mo->Vel.Z = (pr_soaexplode() & 7) + 5;
		}
	}
	// Spawn an item?
	PClassActor *type = P_GetSpawnableType(self->args[0]);
	if (type != NULL)
	{
		if (!((level.flags2 & LEVEL2_NOMONSTERS) || (dmflags & DF_NO_MONSTERS))
		|| !(GetDefaultByType (type)->flags3 & MF3_ISMONSTER))
		{ // Only spawn monsters if not -nomonsters
			Spawn (type, self->Pos(), ALLOW_REPLACE);
		}
	}
	S_Sound (self, CHAN_BODY, self->DeathSound, 1, ATTN_NORM);
	self->Destroy ();
	return 0;
}